

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O0

void rng_init(RNG_state *newstate,int seed)

{
  int local_88;
  uchar local_84 [4];
  int i;
  state_t gen;
  sha1_ctx_s ctx;
  int seed_local;
  RNG_state *newstate_local;
  
  for (local_88 = 0; local_88 < 0x10; local_88 = local_88 + 1) {
    local_84[local_88] = '\0';
  }
  gen.state[8] = (uint_8t)((uint)seed >> 0x18);
  gen.state[9] = (uint_8t)((uint)seed >> 0x10);
  gen.state[10] = (uint_8t)((uint)seed >> 8);
  gen.state[0xb] = (uint_8t)seed;
  sha1_begin((sha1_ctx *)(gen.state + 0xc));
  sha1_hash(local_84,0x14,(sha1_ctx *)(gen.state + 0xc));
  sha1_end(newstate,(sha1_ctx *)(gen.state + 0xc));
  return;
}

Assistant:

void rng_init(RNG_state *newstate, int seed)
{
  struct sha1_context ctx;
  struct state_t gen;
  int i;

  for (i=0; i < 16; i++) 
    gen.state[i] = 0;
  gen.state[16] = 0xFF & (seed >> 24);
  gen.state[17] = 0xFF & (seed >> 16);
  gen.state[18] = 0xFF & (seed >> 8);
  gen.state[19] = 0xFF & (seed >> 0);
  
  sha1_begin(&ctx);
  sha1_hash(gen.state, 20, &ctx);
  sha1_end(newstate, &ctx);
}